

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__tga_test(stbi__context *s)

{
  byte bVar1;
  stbi_uc sVar2;
  int iVar3;
  int tga_color_type;
  int sz;
  int res;
  stbi__context *s_local;
  
  tga_color_type = 0;
  stbi__get8(s);
  bVar1 = stbi__get8(s);
  if (1 < bVar1) goto LAB_0010a2ee;
  sVar2 = stbi__get8(s);
  if (bVar1 == 1) {
    if ((sVar2 != '\x01') && (sVar2 != '\t')) goto LAB_0010a2ee;
    stbi__skip(s,4);
    sVar2 = stbi__get8(s);
    if (((sVar2 != '\b') && ((sVar2 != '\x0f' && (sVar2 != '\x10')))) &&
       ((sVar2 != '\x18' && (sVar2 != ' ')))) goto LAB_0010a2ee;
    stbi__skip(s,4);
  }
  else {
    if ((((sVar2 != '\x02') && (sVar2 != '\x03')) && (sVar2 != '\n')) && (sVar2 != '\v'))
    goto LAB_0010a2ee;
    stbi__skip(s,9);
  }
  iVar3 = stbi__get16le(s);
  if ((((0 < iVar3) && (iVar3 = stbi__get16le(s), 0 < iVar3)) &&
      ((sVar2 = stbi__get8(s), bVar1 != 1 || ((sVar2 == '\b' || (sVar2 == '\x10')))))) &&
     ((sVar2 == '\b' ||
      ((((sVar2 == '\x0f' || (sVar2 == '\x10')) || (sVar2 == '\x18')) || (sVar2 == ' ')))))) {
    tga_color_type = 1;
  }
LAB_0010a2ee:
  stbi__rewind(s);
  return tga_color_type;
}

Assistant:

static int stbi__tga_test(stbi__context *s)
{
   int res = 0;
   int sz, tga_color_type;
   stbi__get8(s);      //   discard Offset
   tga_color_type = stbi__get8(s);   //   color type
   if ( tga_color_type > 1 ) goto errorEnd;   //   only RGB or indexed allowed
   sz = stbi__get8(s);   //   image type
   if ( tga_color_type == 1 ) { // colormapped (paletted) image
      if (sz != 1 && sz != 9) goto errorEnd; // colortype 1 demands image type 1 or 9
      stbi__skip(s,4);       // skip index of first colormap entry and number of entries
      sz = stbi__get8(s);    //   check bits per palette color entry
      if ( (sz != 8) && (sz != 15) && (sz != 16) && (sz != 24) && (sz != 32) ) goto errorEnd;
      stbi__skip(s,4);       // skip image x and y origin
   } else { // "normal" image w/o colormap
      if ( (sz != 2) && (sz != 3) && (sz != 10) && (sz != 11) ) goto errorEnd; // only RGB or grey allowed, +/- RLE
      stbi__skip(s,9); // skip colormap specification and image x/y origin
   }
   if ( stbi__get16le(s) < 1 ) goto errorEnd;      //   test width
   if ( stbi__get16le(s) < 1 ) goto errorEnd;      //   test height
   sz = stbi__get8(s);   //   bits per pixel
   if ( (tga_color_type == 1) && (sz != 8) && (sz != 16) ) goto errorEnd; // for colormapped images, bpp is size of an index
   if ( (sz != 8) && (sz != 15) && (sz != 16) && (sz != 24) && (sz != 32) ) goto errorEnd;

   res = 1; // if we got this far, everything's good and we can return 1 instead of 0

errorEnd:
   stbi__rewind(s);
   return res;
}